

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void CEditor::EnvelopeEval(float TimeOffset,int Env,float *pChannels,void *pUser)

{
  int *piVar1;
  
  if ((-1 < Env) && (Env < *(int *)((long)pUser + 0x127c))) {
    piVar1 = *(int **)(*(long *)((long)pUser + 0x1270) + (ulong)(uint)Env * 8);
    CRenderTools::RenderEvalEnvelope
              (*(CEnvPoint **)(piVar1 + 2),piVar1[5],*piVar1,
               (TimeOffset + *(float *)((long)pUser + 0x10c0)) * *(float *)((long)pUser + 0x10c4),
               pChannels);
    return;
  }
  pChannels[0] = 0.0;
  pChannels[1] = 0.0;
  pChannels[2] = 0.0;
  pChannels[3] = 0.0;
  return;
}

Assistant:

void CEditor::EnvelopeEval(float TimeOffset, int Env, float *pChannels, void *pUser)
{
	CEditor *pThis = (CEditor *)pUser;
	if(Env < 0 || Env >= pThis->m_Map.m_lEnvelopes.size())
	{
		pChannels[0] = 0;
		pChannels[1] = 0;
		pChannels[2] = 0;
		pChannels[3] = 0;
		return;
	}

	CEnvelope *e = pThis->m_Map.m_lEnvelopes[Env];
	float t = pThis->m_AnimateTime+TimeOffset;
	t *= pThis->m_AnimateSpeed;
	e->Eval(t, pChannels);
}